

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::read_decimal_fraction
          (basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
           *this,string_type *result,error_code *ec)

{
  size_t *psVar1;
  byte *pbVar2;
  pointer puVar3;
  uint8_t *puVar4;
  byte bVar5;
  uint64_t uVar6;
  uint64_t value;
  int64_t value_00;
  basic_bigint<std::allocator<unsigned_char>_> *n_00;
  byte *pbVar7;
  byte bVar8;
  cbor_errc cVar9;
  size_type length;
  _Alloc_hider buffer;
  bigint n;
  string_type str;
  basic_bigint<std::allocator<unsigned_char>_> bStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_bigint<std::allocator<unsigned_char>_> local_80;
  basic_bigint<std::allocator<unsigned_char>_> local_58;
  
  uVar6 = get_uint64_value(this,ec);
  if (ec->_M_value != 0) {
    return;
  }
  if (uVar6 != 2) {
LAB_002d8ad8:
    cVar9 = invalid_decimal_fraction;
LAB_002d8aea:
    std::error_code::operator=(ec,cVar9);
    this->more_ = false;
    return;
  }
  pbVar7 = (this->source_).current_.p_;
  if (pbVar7 == (this->source_).end_.p_) {
    cVar9 = unexpected_eof;
    goto LAB_002d8aea;
  }
  bVar8 = *pbVar7 >> 5;
  if (bVar8 == 0) {
    uVar6 = get_uint64_value(this,ec);
  }
  else {
    if (bVar8 != 1) goto LAB_002d8ad8;
    uVar6 = get_int64_value(this,ec);
  }
  if (ec->_M_value != 0) {
    return;
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  pbVar7 = (this->source_).current_.p_;
  pbVar2 = (this->source_).end_.p_;
  cVar9 = unexpected_eof;
  if (pbVar7 == pbVar2) {
LAB_002d8d67:
    std::error_code::operator=(ec,cVar9);
  }
  else {
    bVar8 = *pbVar7;
    bVar5 = bVar8 >> 5;
    if (bVar5 != 6) {
      if (bVar5 == 1) {
        value_00 = get_int64_value(this,ec);
        if (ec->_M_value != 0) goto LAB_002d8d76;
        detail::from_integer<long,std::__cxx11::string>(value_00,&local_a0);
      }
      else {
        if (bVar5 != 0) {
          cVar9 = invalid_decimal_fraction;
          goto LAB_002d8d67;
        }
        value = get_uint64_value(this,ec);
        if (ec->_M_value != 0) goto LAB_002d8d76;
        detail::from_integer<unsigned_long,std::__cxx11::string>(value,&local_a0);
      }
      goto LAB_002d8d32;
    }
    pbVar7 = pbVar7 + 1;
    (this->source_).current_.p_ = pbVar7;
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + 1;
    if (pbVar7 == pbVar2) goto LAB_002d8d67;
    if ((*pbVar7 & 0xe0) != 0x40) {
LAB_002d8d32:
      cVar9 = invalid_decimal_fraction;
      if (0xffffffff80000001 < local_a0._M_string_length - 0x7fffffff &&
          0xffffffff00000001 < uVar6 - 0x7fffffff) {
        length = local_a0._M_string_length;
        buffer._M_p = local_a0._M_dataplus._M_p;
        if (*local_a0._M_dataplus._M_p == '-') {
          std::__cxx11::string::push_back((char)result);
          buffer._M_p = local_a0._M_dataplus._M_p + 1;
          length = local_a0._M_string_length - 1;
        }
        detail::prettify_string<std::__cxx11::string>(buffer._M_p,length,(int)uVar6,-4,0x11,result);
        goto LAB_002d8d76;
      }
      goto LAB_002d8d67;
    }
    puVar3 = (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar3) {
      (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar3;
    }
    read_byte_string(this,&this->bytes_buffer_,ec);
    if (ec->_M_value == 0) {
      bVar8 = bVar8 & 0x1f;
      if (bVar8 == 3) {
        puVar4 = (this->bytes_buffer_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                  (&bStack_c8,1,puVar4,
                   (long)(this->bytes_buffer_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar4);
        local_58.field_0._0_1_ = local_58.field_0._0_1_ & 0xfc | 2;
        local_58.field_0.common_stor_.length_ = 1;
        local_58.field_0.short_stor_.values_[0] = 1;
        local_58.field_0.short_stor_.values_[1] = 0;
        n_00 = basic_bigint<std::allocator<unsigned_char>_>::operator-=(&local_58,&bStack_c8);
        basic_bigint<std::allocator<unsigned_char>_>::basic_bigint(&local_80,n_00);
        basic_bigint<std::allocator<unsigned_char>_>::operator=(&bStack_c8,&local_80);
        if (((local_80.field_0._0_1_ & 1) != 0) &&
           ((pointer)local_80.field_0.short_stor_.values_[1] != (pointer)0x0)) {
          operator_delete(local_80.field_0.dynamic_stor_.data_,
                          local_80.field_0.short_stor_.values_[0] << 3);
        }
        if (((local_58.field_0._0_1_ & 1) != 0) &&
           ((pointer)local_58.field_0.short_stor_.values_[1] != (pointer)0x0)) {
          operator_delete(local_58.field_0.dynamic_stor_.data_,
                          local_58.field_0.short_stor_.values_[0] << 3);
        }
        basic_bigint<std::allocator<unsigned_char>>::
        write_string<char,std::char_traits<char>,std::allocator<char>>
                  ((basic_bigint<std::allocator<unsigned_char>> *)&bStack_c8,&local_a0);
      }
      else {
        if (bVar8 != 2) goto LAB_002d8d32;
        puVar4 = (this->bytes_buffer_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                  (&bStack_c8,1,puVar4,
                   (long)(this->bytes_buffer_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar4);
        basic_bigint<std::allocator<unsigned_char>>::
        write_string<char,std::char_traits<char>,std::allocator<char>>
                  ((basic_bigint<std::allocator<unsigned_char>> *)&bStack_c8,&local_a0);
      }
      if (((bStack_c8.field_0._0_1_ & 1) != 0) &&
         ((pointer)bStack_c8.field_0.short_stor_.values_[1] != (pointer)0x0)) {
        operator_delete(bStack_c8.field_0.dynamic_stor_.data_,
                        bStack_c8.field_0.short_stor_.values_[0] << 3);
      }
      goto LAB_002d8d32;
    }
  }
  this->more_ = false;
LAB_002d8d76:
  basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,std::allocator<char>>
  ::read_decimal_fraction();
  return;
}

Assistant:

void read_decimal_fraction(string_type& result, std::error_code& ec)
    {
        std::size_t size = get_size(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        if (size != 2)
        {
            ec = cbor_errc::invalid_decimal_fraction;
            more_ = false;
            return;
        }

        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        int64_t exponent = 0;
        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                exponent = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                exponent = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_decimal_fraction;
                more_ = false;
                return;
            }
        }

        string_type str(alloc_);

        c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }

        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                uint64_t val = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                jsoncons::detail::from_integer(val, str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                int64_t val = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                jsoncons::detail::from_integer(val, str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::semantic_tag:
            {
                uint8_t b;
                if (source_.read(&b, 1) == 0)
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                uint8_t tag = get_additional_information_value(b);
                c = source_.peek();
                if (JSONCONS_UNLIKELY(c.eof))
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                if (get_major_type(c.value) == jsoncons::cbor::detail::cbor_major_type::byte_string)
                {
                    bytes_buffer_.clear();
                    read_byte_string(bytes_buffer_, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    if (tag == 2)
                    {
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n.write_string(str);
                    }
                    else if (tag == 3)
                    {
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n = -1 - n;
                        n.write_string(str);
                    }
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_decimal_fraction;
                more_ = false;
                return;
            }
        }

        if (str.size() >= static_cast<std::size_t>((std::numeric_limits<int32_t>::max)()) || 
            exponent >= (std::numeric_limits<int32_t>::max)() || 
            exponent <= (std::numeric_limits<int32_t>::min)())
        {
            ec = cbor_errc::invalid_decimal_fraction;
            more_ = false;
            return;
        }
        else if (str.size() > 0)
        {
            if (str[0] == '-')
            {
                result.push_back('-');
                jsoncons::detail::prettify_string(str.c_str()+1, str.size()-1, (int)exponent, -4, 17, result);
            }
            else
            {
                jsoncons::detail::prettify_string(str.c_str(), str.size(), (int)exponent, -4, 17, result);
            }
        }
        else
        {
            ec = cbor_errc::invalid_decimal_fraction;
            more_ = false;
            return;
        }
    }